

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::SetValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *m;
  TemplateString value_00;
  TemplateString local_38;
  
  LazilyCreateDict<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
            (this,&this->variable_dict_);
  m = this->variable_dict_;
  Memdup(&local_38,this,&value);
  value_00.length_ = local_38.length_;
  value_00.ptr_ = local_38.ptr_;
  value_00.is_immutable_ = local_38.is_immutable_;
  value_00._17_7_ = local_38._17_7_;
  value_00.id_ = local_38.id_;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
            (m,variable,value_00);
  return;
}

Assistant:

void TemplateDictionary::SetValue(const TemplateString variable,
                                  const TemplateString value) {
  LazilyCreateDict(&variable_dict_);
  HashInsert(variable_dict_, variable, Memdup(value));
}